

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O2

void sort_rec3(float *array,int *perm,int size)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  for (; 0xf < size; size = (size - iVar11) - (int)lVar13) {
    fVar1 = array[(uint)size >> 1];
    lVar14 = -1;
    uVar7 = (ulong)(uint)size;
    while( true ) {
      iVar11 = (int)lVar14;
      lVar8 = (long)iVar11;
      lVar13 = 0;
      lVar15 = 0;
      do {
        fVar2 = array[lVar8 + lVar13 + 1];
        lVar15 = lVar15 + -4;
        lVar13 = lVar13 + 1;
      } while (fVar2 < fVar1);
      uVar7 = (ulong)(int)uVar7;
      lVar14 = lVar8 + lVar13;
      do {
        lVar4 = uVar7 - 1;
        uVar7 = uVar7 - 1;
      } while (fVar1 < array[lVar4]);
      if ((long)uVar7 <= lVar14) break;
      array[lVar8 + lVar13] = array[lVar4];
      array[uVar7] = fVar2;
      iVar11 = perm[lVar8 + lVar13];
      perm[lVar8 + lVar13] = perm[uVar7];
      perm[uVar7] = iVar11;
    }
    sort_rec3(array,perm,(int)lVar13 + iVar11);
    perm = (int *)((long)perm + ((long)iVar11 * 4 - lVar15));
    array = (float *)((long)array + ((long)iVar11 * 4 - lVar15));
  }
  uVar6 = 1;
  if (1 < size) {
    uVar6 = size;
  }
  uVar7 = 1;
  for (uVar9 = 0; uVar9 != uVar6 - 1; uVar9 = uVar9 + 1) {
    uVar12 = uVar9 & 0xffffffff;
    for (uVar10 = uVar7; iVar11 = (int)uVar12, (uint)size != uVar10; uVar10 = uVar10 + 1) {
      uVar5 = uVar10 & 0xffffffff;
      if (array[iVar11] < array[uVar10] || array[iVar11] == array[uVar10]) {
        uVar5 = uVar12;
      }
      uVar12 = uVar5;
    }
    fVar1 = array[uVar9];
    array[uVar9] = array[iVar11];
    array[iVar11] = fVar1;
    iVar3 = perm[uVar9];
    perm[uVar9] = perm[iVar11];
    perm[iVar11] = iVar3;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

static void sort_rec3(float* array, int* perm, int size)
{
    if (size <= 15)
        selectionsort3(array, perm, size);
    else{
        float  pivot = array[size/2];
        float  tmpf;
        int    tmpi;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmpf = array[i]; array[i] = array[j]; array[j] = tmpf;
            tmpi = perm[i];  perm[i]  = perm[j];  perm[j]  = tmpi;
        }
        sort_rec3(array    , perm,     i     );
        sort_rec3(&array[i], &perm[i], size-i);
    }
}